

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O1

QHash<QByteArray,_QByteArray>
QAuthenticatorPrivate::parseDigestAuthenticationChallenge(QByteArrayView challenge)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  Entry *pEVar4;
  QStringTokenizerBaseBase QVar5;
  undefined1 *puVar6;
  char *pcVar7;
  byte *pbVar8;
  char cVar9;
  QHash<QByteArray,_QByteArray> QVar10;
  ulong uVar11;
  byte *in_RDX;
  byte bVar12;
  byte *pbVar13;
  Data *pDVar14;
  long in_FS_OFFSET;
  bool bVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  iterator __begin1;
  QByteArray local_b8;
  QHash<QByteArray,_QByteArray> local_a0;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  pDVar14 = (Data *)challenge.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0.d = (Data *)0x0;
  pbVar1 = in_RDX + (long)challenge.m_data;
  pbVar2 = in_RDX + (long)challenge.m_data;
  do {
    if (pbVar1 <= in_RDX) break;
    do {
      pbVar8 = in_RDX;
      pbVar13 = in_RDX;
      if ((0x20 < (ulong)*in_RDX) || ((0x100002400U >> ((ulong)*in_RDX & 0x3f) & 1) == 0)) break;
      in_RDX = in_RDX + 1;
      pbVar8 = in_RDX;
      pbVar13 = in_RDX;
    } while (in_RDX < pbVar1);
    for (; (pbVar8 < pbVar1 && (*pbVar8 != 0x3d)); pbVar8 = pbVar8 + 1) {
    }
    in_RDX = pbVar8 + 1;
    if (in_RDX < pbVar1) {
      bVar12 = pbVar8[1];
      if (bVar12 == 0x22) {
        in_RDX = pbVar8 + 2;
      }
      if (pbVar1 <= in_RDX) goto LAB_001a5402;
      local_58.super_QStringTokenizerBaseBase.m_sb.
      super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
      super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
           (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
      local_58.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
      local_58.m_haystack.m_size = 0;
      local_58.m_haystack.m_data = (char *)0x0;
      do {
        if (pbVar1 <= in_RDX) break;
        bVar3 = *in_RDX;
        bVar15 = in_RDX < pbVar2 + -1;
        in_RDX = in_RDX + (bVar15 && bVar3 == 0x5c);
        if (bVar15 && bVar3 == 0x5c) {
LAB_001a52d9:
          QByteArray::append((char)&local_58);
          in_RDX = in_RDX + 1;
          bVar15 = true;
        }
        else {
          if (bVar12 != 0x22) {
            if (*in_RDX == 0x2c) goto LAB_001a5301;
            goto LAB_001a52d9;
          }
          if (*in_RDX != 0x22) goto LAB_001a52d9;
LAB_001a5301:
          bVar15 = false;
        }
      } while (bVar15);
      for (; (in_RDX < pbVar1 && (*in_RDX != 0x2c)); in_RDX = in_RDX + 1) {
      }
      QByteArray::QByteArray(&local_b8,(char *)pbVar13,(long)pbVar8 - (long)pbVar13);
      QHash<QByteArray,QByteArray>::tryEmplace_impl<QByteArray_const&>
                ((TryEmplaceResult *)local_98,(QHash<QByteArray,QByteArray> *)&local_a0,&local_b8);
      pEVar4 = (*(Span **)(local_98._0_8_ + 0x20))[(ulong)local_98._8_8_ >> 7].entries;
      uVar11 = (ulong)((uint)(*(Span **)(local_98._0_8_ + 0x20))[(ulong)local_98._8_8_ >> 7].offsets
                             [(uint)local_98._8_8_ & 0x7f] * 0x30);
      QVar5 = *(QStringTokenizerBaseBase *)((pEVar4->storage).data + uVar11 + 0x18);
      *(QStringTokenizerBaseBase *)((pEVar4->storage).data + uVar11 + 0x18) =
           local_58.super_QStringTokenizerBaseBase;
      puVar6 = *(undefined1 **)((pEVar4->storage).data + uVar11 + 0x20);
      *(qsizetype *)((pEVar4->storage).data + uVar11 + 0x20) = local_58.m_haystack.m_size;
      pcVar7 = *(char **)((pEVar4->storage).data + uVar11 + 0x28);
      *(char **)((pEVar4->storage).data + uVar11 + 0x28) = local_58.m_haystack.m_data;
      local_58.super_QStringTokenizerBaseBase = QVar5;
      local_58.m_haystack.m_size = (qsizetype)puVar6;
      local_58.m_haystack.m_data = pcVar7;
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (local_58.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
        LOCK();
        *(int *)local_58.super_QStringTokenizerBaseBase =
             *(int *)local_58.super_QStringTokenizerBaseBase + -1;
        UNLOCK();
        if (*(int *)local_58.super_QStringTokenizerBaseBase == 0) {
          QArrayData::deallocate((QArrayData *)local_58.super_QStringTokenizerBaseBase,1,0x10);
        }
      }
      in_RDX = in_RDX + 1;
      bVar15 = true;
    }
    else {
LAB_001a5402:
      bVar15 = false;
    }
  } while (bVar15);
  local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)local_98,"qop",-1);
  QHash<QByteArray,_QByteArray>::value(&local_b8,&local_a0,(QByteArray *)local_98);
  if ((Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)local_98._0_8_ !=
      (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,1,0x10);
    }
  }
  if ((undefined1 *)local_b8.d.size != (undefined1 *)0x0) {
    local_58.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
    local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
    local_58.m_haystack.m_size = local_b8.d.size;
    local_58.m_haystack.m_data = local_b8.d.ptr;
    local_58.m_needle.ucs = L',';
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator((iterator *)local_98,&local_58);
    bVar12 = local_98[0x18];
    if (local_98[0x18] == true) {
      bVar12 = 1;
      do {
        if (((undefined1 *)local_98._8_8_ == &DAT_00000004) &&
           (QVar16.m_data = (char *)local_98._16_8_, QVar16.m_size = 4, QVar17.m_data = "auth",
           QVar17.m_size = 4, cVar9 = QtPrivate::equalStrings(QVar16,QVar17), cVar9 != '\0')) break;
        QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_98);
        bVar12 = local_98[0x18];
      } while (local_98[0x18] != false);
    }
    if ((bVar12 & 1) == 0) {
      *(undefined8 *)pDVar14 = 0;
      QVar10.d = (Data *)0x0;
      goto LAB_001a55db;
    }
    QByteArray::QByteArray((QByteArray *)&local_58,"qop",-1);
    QHash<QByteArray,QByteArray>::tryEmplace_impl<QByteArray_const&>
              ((TryEmplaceResult *)local_98,(QHash<QByteArray,QByteArray> *)&local_a0,
               (QByteArray *)&local_58);
    QByteArray::operator=
              ((QByteArray *)
               ((((*(Span **)(local_98._0_8_ + 0x20))[(ulong)local_98._8_8_ >> 7].entries)->storage)
                .data + (ulong)((uint)(*(Span **)(local_98._0_8_ + 0x20))
                                      [(ulong)local_98._8_8_ >> 7].offsets
                                      [(uint)local_98._8_8_ & 0x7f] * 0x30) + 0x18),"auth");
    if (local_58.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
      LOCK();
      *(int *)local_58.super_QStringTokenizerBaseBase =
           *(int *)local_58.super_QStringTokenizerBaseBase + -1;
      UNLOCK();
      if (*(int *)local_58.super_QStringTokenizerBaseBase == 0) {
        QArrayData::deallocate((QArrayData *)local_58.super_QStringTokenizerBaseBase,1,0x10);
      }
    }
  }
  QVar10.d = local_a0.d;
  local_a0.d = (Data *)0x0;
LAB_001a55db:
  *(Data **)pDVar14 = QVar10.d;
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
    }
  }
  QHash<QByteArray,_QByteArray>::~QHash(&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QHash<QByteArray,_QByteArray>)pDVar14;
}

Assistant:

QHash<QByteArray, QByteArray>
QAuthenticatorPrivate::parseDigestAuthenticationChallenge(QByteArrayView challenge)
{
    QHash<QByteArray, QByteArray> options;
    // parse the challenge
    const char *d = challenge.data();
    const char *end = d + challenge.size();
    while (d < end) {
        while (d < end && (*d == ' ' || *d == '\n' || *d == '\r'))
            ++d;
        const char *start = d;
        while (d < end && *d != '=')
            ++d;
        QByteArrayView key = QByteArrayView(start, d - start);
        ++d;
        if (d >= end)
            break;
        bool quote = (*d == '"');
        if (quote)
            ++d;
        if (d >= end)
            break;
        QByteArray value;
        while (d < end) {
            bool backslash = false;
            if (*d == '\\' && d < end - 1) {
                ++d;
                backslash = true;
            }
            if (!backslash) {
                if (quote) {
                    if (*d == '"')
                        break;
                } else {
                    if (*d == ',')
                        break;
                }
            }
            value += *d;
            ++d;
        }
        while (d < end && *d != ',')
            ++d;
        ++d;
        options[key.toByteArray()] = std::move(value);
    }

    QByteArray qop = options.value("qop");
    if (!qop.isEmpty()) {
        if (!containsAuth(qop))
            return QHash<QByteArray, QByteArray>();
        // #### can't do auth-int currently
//         if (qop.contains("auth-int"))
//             qop = "auth-int";
//         else if (qop.contains("auth"))
//             qop = "auth";
//         else
//             qop = QByteArray();
        options["qop"] = "auth";
    }

    return options;
}